

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

bool __thiscall QTreeModel::clearItemData(QTreeModel *this,QModelIndex *index)

{
  long lVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  QAbstractItemModel *pQVar5;
  pointer pQVar6;
  pointer pQVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  QAbstractItemModel *pQVar12;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QAbstractItemModel::checkIndex(this,index,1);
  if (cVar3 == '\0') {
    bVar4 = false;
    goto LAB_005b9908;
  }
  pQVar5 = (index->m).ptr;
  if (pQVar5 != (QAbstractItemModel *)0x0) {
    pQVar5 = (QAbstractItemModel *)index->i;
  }
  pQVar12 = (QAbstractItemModel *)0x0;
  if (-1 < (index->r | index->c)) {
    pQVar12 = pQVar5;
  }
  bVar4 = pQVar12 != (QAbstractItemModel *)0x0;
  if (pQVar12 == (QAbstractItemModel *)0x0) goto LAB_005b9908;
  lVar11 = (long)index->c;
  lVar8 = *(long *)(*(long *)(pQVar12 + 0x18) + 8 + lVar11 * 0x18);
  lVar9 = *(long *)(*(long *)(pQVar12 + 0x18) + 0x10 + lVar11 * 0x18);
  lVar1 = lVar8 + lVar9 * 0x28;
  lVar9 = lVar9 >> 2;
  lVar10 = lVar8;
  if (0 < lVar9) {
    lVar10 = lVar9 * 0xa0 + lVar8;
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x50;
    do {
      if (3 < *(ulong *)(lVar8 + -0x30)) {
        lVar8 = lVar8 + -0x50;
        goto LAB_005b9847;
      }
      if (3 < *(ulong *)(lVar8 + -8)) {
        lVar8 = lVar8 + -0x28;
        goto LAB_005b9847;
      }
      if (3 < *(ulong *)(lVar8 + 0x20)) goto LAB_005b9847;
      if (3 < *(ulong *)(lVar8 + 0x48)) {
        lVar8 = lVar8 + 0x28;
        goto LAB_005b9847;
      }
      lVar9 = lVar9 + -1;
      lVar8 = lVar8 + 0xa0;
    } while (1 < lVar9);
  }
  lVar9 = (lVar1 - lVar10 >> 3) * -0x3333333333333333;
  if (lVar9 == 1) {
LAB_005b9822:
    lVar8 = lVar10;
    if (*(ulong *)(lVar10 + 0x20) < 4) {
      lVar8 = lVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_005b9817:
    lVar8 = lVar10;
    if (*(ulong *)(lVar10 + 0x20) < 4) {
      lVar10 = lVar10 + 0x28;
      goto LAB_005b9822;
    }
  }
  else {
    lVar8 = lVar1;
    if ((lVar9 == 3) && (lVar8 = lVar10, *(ulong *)(lVar10 + 0x20) < 4)) {
      lVar10 = lVar10 + 0x28;
      goto LAB_005b9817;
    }
  }
LAB_005b9847:
  if ((lVar8 != lVar1) ||
     (bVar4 = true,
     3 < *(ulong *)(*(long *)(*(long *)(pQVar12 + 0x30) + 0x10) + 0x18 + lVar11 * 0x20))) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    pQVar6 = QList<QVariant>::data((QList<QVariant> *)(*(long *)(pQVar12 + 0x30) + 8));
    ::QVariant::operator=(pQVar6 + lVar11,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    iVar2 = index->c;
    pQVar7 = QList<QList<QWidgetItemData>_>::data
                       ((QList<QList<QWidgetItemData>_> *)(pQVar12 + 0x10));
    QList<QWidgetItemData>::clear(pQVar7 + iVar2);
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,4,0x10);
      }
    }
    bVar4 = true;
  }
LAB_005b9908:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QTreeModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTreeWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.at(index.column()).cbegin();
    const auto endIter = itm->values.at(index.column()).cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); })
        && !itm->d->display.at(index.column()).isValid()) {
        return true; //it's already cleared
    }
    itm->d->display[index.column()] = QVariant();
    itm->values[index.column()].clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}